

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

int add_cert_safe_contents
              (CBB *cbb,X509 *cert,stack_st_X509 *chain,char *name,uint8_t *key_id,size_t key_id_len
              )

{
  int iVar1;
  size_t sVar2;
  X509 *cert_00;
  ulong local_78;
  size_t i;
  CBB safe_contents;
  size_t key_id_len_local;
  uint8_t *key_id_local;
  char *name_local;
  stack_st_X509 *chain_local;
  X509 *cert_local;
  CBB *cbb_local;
  
  safe_contents.u._24_8_ = key_id_len;
  iVar1 = CBB_add_asn1(cbb,(CBB *)&i,0x20000010);
  if ((iVar1 == 0) ||
     ((cert != (X509 *)0x0 &&
      (iVar1 = add_cert_bag((CBB *)&i,cert,name,key_id,safe_contents.u._24_8_), iVar1 == 0)))) {
    cbb_local._4_4_ = 0;
  }
  else {
    for (local_78 = 0; sVar2 = sk_X509_num(chain), local_78 < sVar2; local_78 = local_78 + 1) {
      cert_00 = sk_X509_value(chain,local_78);
      iVar1 = add_cert_bag((CBB *)&i,cert_00,(char *)0x0,(uint8_t *)0x0,0);
      if (iVar1 == 0) {
        return 0;
      }
    }
    cbb_local._4_4_ = CBB_flush(cbb);
  }
  return cbb_local._4_4_;
}

Assistant:

static int add_cert_safe_contents(CBB *cbb, X509 *cert,
                                  const STACK_OF(X509) *chain, const char *name,
                                  const uint8_t *key_id, size_t key_id_len) {
  CBB safe_contents;
  if (!CBB_add_asn1(cbb, &safe_contents, CBS_ASN1_SEQUENCE) ||
      (cert != NULL &&
       !add_cert_bag(&safe_contents, cert, name, key_id, key_id_len))) {
    return 0;
  }

  for (size_t i = 0; i < sk_X509_num(chain); i++) {
    // Only the leaf certificate gets attributes.
    if (!add_cert_bag(&safe_contents, sk_X509_value(chain, i), NULL, NULL, 0)) {
      return 0;
    }
  }

  return CBB_flush(cbb);
}